

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmCachePolicyCommon.cpp
# Opt level: O0

GMM_GFX_MEMORY_TYPE __thiscall
GmmLib::GmmCachePolicyCommon::GetWantedMemoryType
          (GmmCachePolicyCommon *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  undefined4 local_14;
  GMM_GFX_MEMORY_TYPE WantedMemoryType;
  GmmCachePolicyCommon *this_local;
  
  if ((CachePolicy.field_1.Value >> 3 & 1) == 0) {
    if ((((undefined1  [40])CachePolicy & (undefined1  [40])0x1) == (undefined1  [40])0x0) &&
       ((CachePolicy.field_1.Value >> 1 & 1) == 0)) {
      local_14 = GMM_GFX_UC_WITH_FENCE;
    }
    else {
      local_14 = GMM_GFX_WB;
    }
  }
  else {
    local_14 = GMM_GFX_WT;
  }
  return local_14;
}

Assistant:

GMM_GFX_MEMORY_TYPE GmmLib::GmmCachePolicyCommon::GetWantedMemoryType(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    GMM_GFX_MEMORY_TYPE WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    if(CachePolicy.WT)
    {
        WantedMemoryType = GMM_GFX_WT;
    }
    else if(!(CachePolicy.LLC || CachePolicy.ELLC))
    {
        WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    }
    else
    {
        WantedMemoryType = GMM_GFX_WB;
    }
    return WantedMemoryType;
}